

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O0

bool anon_unknown.dwarf_72e95::testObjectNoExtra(void)

{
  bool bVar1;
  ErrorCode EVar2;
  Object<(anonymous_namespace)::ObjectStruct> *pOVar3;
  Value *pVVar4;
  ostream *poVar5;
  undefined1 local_1d0 [8];
  ObjectStruct s2;
  undefined1 local_178 [8];
  ObjectStruct s1;
  Value local_128;
  undefined1 local_100 [8];
  Value v;
  string_view local_b8;
  function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
  local_a8;
  string_view local_78;
  ErrorCode local_68 [2];
  Object<(anonymous_namespace)::ObjectStruct> local_60;
  undefined1 local_38 [8];
  Object<(anonymous_namespace)::ObjectStruct> helper;
  
  local_68[1] = 0;
  local_68[0] = InvalidObject;
  cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>
  ::Object(&local_60,local_68 + 1,local_68,false);
  local_78 = (string_view)::cm::operator____s("field1",6);
  std::
  function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
  ::function(&local_a8,
             (function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
              *)(anonymous_namespace)::StringHelper_abi_cxx11_);
  pOVar3 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
           Object<(anonymous_namespace)::ObjectStruct>::
           Bind<(anonymous_namespace)::ObjectStruct,std::__cxx11::string,std::function<(anonymous_namespace)::ErrorCode(std::__cxx11::string&,Json::Value_const*)>>
                     (&local_60,&local_78,0,&local_a8,true);
  local_b8 = (string_view)::cm::operator____s("field2",6);
  std::function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>::function
            ((function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)> *)&v.limit_,
             (function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)> *)
             (anonymous_namespace)::IntHelper);
  pOVar3 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
           Object<(anonymous_namespace)::ObjectStruct>::
           Bind<(anonymous_namespace)::ObjectStruct,int,std::function<(anonymous_namespace)::ErrorCode(int&,Json::Value_const*)>>
                     (pOVar3,&local_b8,0x20,
                      (function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)> *)
                      &v.limit_,true);
  cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>
  ::Object((Object<(anonymous_namespace)::ObjectStruct> *)local_38,pOVar3);
  std::function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>::~function
            ((function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)> *)&v.limit_);
  std::
  function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
  ::~function(&local_a8);
  cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>
  ::~Object(&local_60);
  Json::Value::Value((Value *)local_100,objectValue);
  Json::Value::Value(&local_128,"Hello");
  pVVar4 = Json::Value::operator[]((Value *)local_100,"field1");
  Json::Value::operator=(pVVar4,&local_128);
  Json::Value::~Value(&local_128);
  Json::Value::Value((Value *)&s1.Field2,2);
  pVVar4 = Json::Value::operator[]((Value *)local_100,"field2");
  Json::Value::operator=(pVVar4,(Value *)&s1.Field2);
  Json::Value::~Value((Value *)&s1.Field2);
  ObjectStruct::ObjectStruct((ObjectStruct *)local_178);
  EVar2 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::operator()
                    ((Object<(anonymous_namespace)::ObjectStruct> *)local_38,
                     (ObjectStruct *)local_178,(Value *)local_100);
  if (EVar2 == Success) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_178,"Hello");
    if (bVar1) {
      if (s1.Field1.field_2._8_4_ == 2) {
        Json::Value::Value((Value *)&s2.Field2,"world!");
        pVVar4 = Json::Value::operator[]((Value *)local_100,"extra");
        Json::Value::operator=(pVVar4,(Value *)&s2.Field2);
        Json::Value::~Value((Value *)&s2.Field2);
        ObjectStruct::ObjectStruct((ObjectStruct *)local_1d0);
        EVar2 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                Object<(anonymous_namespace)::ObjectStruct>::operator()
                          ((Object<(anonymous_namespace)::ObjectStruct> *)local_38,
                           (ObjectStruct *)local_1d0,(Value *)local_100);
        helper._39_1_ = EVar2 == InvalidObject;
        if (!(bool)helper._39_1_) {
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(helper(s2, &v) == ErrorCode::InvalidObject) failed on line "
                                  );
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x111);
          std::operator<<(poVar5,"\n");
        }
        ObjectStruct::~ObjectStruct((ObjectStruct *)local_1d0);
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(s1.Field2 == 2) failed on line "
                                );
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x10d);
        std::operator<<(poVar5,"\n");
        helper._39_1_ = 0;
      }
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(s1.Field1 == \"Hello\") failed on line ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x10c);
      std::operator<<(poVar5,"\n");
      helper._39_1_ = 0;
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(helper(s1, &v) == ErrorCode::Success) failed on line ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x10b);
    std::operator<<(poVar5,"\n");
    helper._39_1_ = 0;
  }
  ObjectStruct::~ObjectStruct((ObjectStruct *)local_178);
  Json::Value::~Value((Value *)local_100);
  cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>
  ::~Object((Object<(anonymous_namespace)::ObjectStruct> *)local_38);
  return (bool)(helper._39_1_ & 1);
}

Assistant:

bool testObjectNoExtra()
{
  auto const helper = JSONHelperBuilder::Object<ObjectStruct>(
                        ErrorCode::Success, ErrorCode::InvalidObject, false)
                        .Bind("field1"_s, &ObjectStruct::Field1, StringHelper)
                        .Bind("field2"_s, &ObjectStruct::Field2, IntHelper);

  Json::Value v(Json::objectValue);
  v["field1"] = "Hello";
  v["field2"] = 2;

  ObjectStruct s1;
  ASSERT_TRUE(helper(s1, &v) == ErrorCode::Success);
  ASSERT_TRUE(s1.Field1 == "Hello");
  ASSERT_TRUE(s1.Field2 == 2);

  v["extra"] = "world!";
  ObjectStruct s2;
  ASSERT_TRUE(helper(s2, &v) == ErrorCode::InvalidObject);

  return true;
}